

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_reshape(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  _Bool _Var1;
  ggml_tensor *tensor;
  char *pcVar2;
  int line;
  
  _Var1 = ggml_is_contiguous_0(a);
  if (_Var1) {
    if (a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3] - b->ne[1] * b->ne[0] * b->ne[2] * b->ne[3] == 0)
    {
      tensor = ggml_new_tensor_impl(ctx,a->type,4,b->ne,a,0);
      ggml_format_name(tensor,"%s (reshaped)",a->name);
      tensor->op = GGML_OP_RESHAPE;
      tensor->src[0] = a;
      return tensor;
    }
    pcVar2 = "ggml_nelements(a) == ggml_nelements(b)";
    line = 0xbf9;
  }
  else {
    pcVar2 = "ggml_is_contiguous(a)";
    line = 0xbf7;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_reshape(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        struct ggml_tensor * b) {
    GGML_ASSERT(ggml_is_contiguous(a));
    // as only the shape of b is relevant, and not its memory layout, b is allowed to be non contiguous.
    GGML_ASSERT(ggml_nelements(a) == ggml_nelements(b));

    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, GGML_MAX_DIMS, b->ne, a, 0);
    ggml_format_name(result, "%s (reshaped)", a->name);

    result->op     = GGML_OP_RESHAPE;
    result->src[0] = a;

    return result;
}